

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::
     pair_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>(string *type,Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  allocator<char> local_e1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Type_Info local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,type);
  local_50.m_type_info =
       (type_info *)&std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::typeinfo;
  local_50.m_bare_type_info =
       (type_info *)&std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::typeinfo;
  local_50.m_flags = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,&local_50,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_50.m_type_info = (type_info *)0x0;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<chaiscript::Boxed_Value,std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::*>
            ((chaiscript *)&local_c0,
             (offset_in_pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_to_Boxed_Value *)
             &local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"first",&local_e1);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c0,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_50.m_type_info = (type_info *)0x10;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<chaiscript::Boxed_Value,std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::*>
            ((chaiscript *)&local_d0,
             (offset_in_pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_to_Boxed_Value *)
             &local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"second",&local_e1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d0,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  basic_constructors<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>(type,m);
  constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)>
            ();
  std::__cxx11::string::string((string *)&local_b0,type);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e0,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void pair_type(const std::string &type, Module &m) {
    m.add(user_type<PairType>(), type);

    m.add(fun(&PairType::first), "first");
    m.add(fun(&PairType::second), "second");

    basic_constructors<PairType>(type, m);
    m.add(constructor<PairType(const typename PairType::first_type &, const typename PairType::second_type &)>(), type);
  }